

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O2

void __thiscall OB::Term::ostream::streambuf::~streambuf(streambuf *this)

{
  *(undefined ***)this = &PTR__streambuf_0010fd00;
  flush(this);
  std::__cxx11::string::~string((string *)&this->_esc_seq);
  std::__cxx11::string::~string((string *)&this->_buffer);
  std::__cxx11::string::~string((string *)&this->_prefix);
  std::streambuf::~streambuf(this);
  return;
}

Assistant:

~streambuf()
    {
      flush();
    }